

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

string * testing::internal::
         DefaultParamName<std::tuple<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int),BLOCK_SIZE>>
                   (TestParamInfo<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE>_>
                    *info)

{
  Message *in_RSI;
  string *in_RDI;
  Message name_stream;
  unsigned_long *in_stack_ffffffffffffffb8;
  string *this;
  
  this = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<((Message *)in_RDI,in_stack_ffffffffffffffb8);
  Message::GetString_abi_cxx11_((Message *)this);
  Message::~Message((Message *)0xad1c9a);
  return this;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}